

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpFormat.h
# Opt level: O0

void __thiscall brynet::net::HttpResponse::setBody(HttpResponse *this,string *body)

{
  unsigned_long __val;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *body_local;
  HttpResponse *this_local;
  
  local_18 = body;
  body_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->mBody,(string *)body);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Content-Length",&local_39)
  ;
  __val = std::__cxx11::string::size();
  std::__cxx11::to_string(&local_70,__val);
  addHeadValue(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void        setBody(const std::string& body)
            {
                mBody = body;
                addHeadValue("Content-Length", std::to_string(body.size()));
            }